

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<float>::Assemble
          (TPZDohrAssembly<float> *this,int isub,TPZFMatrix<float> *local,TPZFMatrix<float> *global)

{
  int iVar1;
  int iVar2;
  TPZVec<int> *this_00;
  int64_t iVar3;
  float *pfVar4;
  TPZFMatrix<float> *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  float extraout_XMM0_Da;
  int ic;
  int ieq;
  int ncols;
  int neq;
  TPZVec<int> *avec;
  int local_38;
  int local_34;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 8),(long)in_ESI);
  iVar3 = TPZVec<int>::NElements(this_00);
  iVar1 = (int)iVar3;
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  iVar2 = (int)iVar3;
  for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,(long)local_34,(long)local_38);
      TPZVec<int>::operator[](this_00,(long)local_34);
      pfVar4 = TPZFMatrix<float>::operator()(in_RCX,(int64_t)this_00,CONCAT44(iVar1,iVar2));
      *pfVar4 = extraout_XMM0_Da + *pfVar4;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Assemble(int isub, const TPZFMatrix<TVar> &local, TPZFMatrix<TVar> &global) const
{
	TPZVec<int> &avec = fFineEqs[isub];
	int neq = avec.NElements();
    int ncols = local.Cols();
	int ieq;
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            global(avec[ieq],ic) += local.GetVal(ieq,ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Assembling destination indices " << avec << std::endl;
		local.Print("Input vector",sout);
		global.Print("Resulting vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}